

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O1

uint32_t FACT_INTERNAL_ParseAudioEngine(FACTAudioEngine *pEngine,FACTRuntimeParameters *pParams)

{
  uint8_t *puVar1;
  undefined4 *puVar2;
  ushort *puVar3;
  byte bVar4;
  ushort uVar5;
  ushort uVar6;
  int iVar7;
  int *piVar8;
  FACTDSPParameter *pFVar9;
  uint32_t uVar10;
  FACTAudioCategory *pFVar11;
  FACTVariable *pFVar12;
  float *pfVar13;
  FACTRPC *pFVar14;
  uint32_t *puVar15;
  FACTRPCPoint *pFVar16;
  FACTDSPPreset *pFVar17;
  void *pvVar18;
  char **ppcVar19;
  char *pcVar20;
  char cVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort *puVar25;
  ulong uVar26;
  int iVar27;
  ulong uVar28;
  long lVar29;
  double dVar30;
  
  piVar8 = (int *)pParams->pGlobalSettingsBuffer;
  iVar7 = *piVar8;
  if ((iVar7 == 0x58475346) || (uVar10 = 0xffffffff, iVar7 == 0x46534758)) {
    uVar5 = *(ushort *)(piVar8 + 1);
    uVar22 = uVar5 << 8 | uVar5 >> 8;
    if (iVar7 != 0x58475346) {
      uVar22 = uVar5;
    }
    uVar10 = 0xfffffffe;
    if (0xfffb < (ushort)(uVar22 - 0x2f)) {
      cVar21 = (char)((ushort)*(undefined2 *)((long)piVar8 + 6) >> 8);
      if (iVar7 != 0x58475346) {
        cVar21 = (char)*(undefined2 *)((long)piVar8 + 6);
      }
      uVar10 = 0xfffffffd;
      if ((cVar21 == '*') && (uVar10 = 0xfffffffc, (*(byte *)((long)piVar8 + 0x12) & 0xfb) == 3)) {
        uVar5 = *(ushort *)((long)piVar8 + 0x13);
        uVar22 = uVar5 << 8 | uVar5 >> 8;
        if (iVar7 != 0x58475346) {
          uVar22 = uVar5;
        }
        pEngine->categoryCount = uVar22;
        uVar5 = *(ushort *)((long)piVar8 + 0x15);
        uVar23 = uVar5 << 8 | uVar5 >> 8;
        if (iVar7 != 0x58475346) {
          uVar23 = uVar5;
        }
        pEngine->variableCount = uVar23;
        uVar5 = *(ushort *)((long)piVar8 + 0x1b);
        uVar23 = *(ushort *)((long)piVar8 + 0x17);
        uVar6 = *(ushort *)((long)piVar8 + 0x19);
        uVar24 = uVar5 << 8 | uVar5 >> 8;
        if (iVar7 != 0x58475346) {
          uVar24 = uVar5;
        }
        pEngine->rpcCount = uVar24;
        uVar5 = *(ushort *)((long)piVar8 + 0x1d);
        uVar24 = uVar5 << 8 | uVar5 >> 8;
        if (iVar7 != 0x58475346) {
          uVar24 = uVar5;
        }
        pEngine->dspPresetCount = uVar24;
        uVar5 = *(ushort *)((long)piVar8 + 0x1f);
        uVar24 = uVar5 << 8 | uVar5 >> 8;
        if (iVar7 != 0x58475346) {
          uVar24 = uVar5;
        }
        uVar5 = uVar6 << 8 | uVar6 >> 8;
        if (iVar7 != 0x58475346) {
          uVar5 = uVar6;
        }
        uVar6 = uVar23 << 8 | uVar23 >> 8;
        if (iVar7 != 0x58475346) {
          uVar6 = uVar23;
        }
        pEngine->dspParameterCount = uVar24;
        puVar25 = (ushort *)((long)piVar8 + 0x4d);
        pFVar11 = (FACTAudioCategory *)(*pEngine->pMalloc)((ulong)uVar22 * 0x18);
        pEngine->categories = pFVar11;
        if (pEngine->categoryCount != 0) {
          lVar29 = 0;
          uVar28 = 0;
          do {
            pFVar11 = pEngine->categories;
            (&pFVar11->instanceLimit)[lVar29] = (uint8_t)*puVar25;
            uVar22 = *(ushort *)((long)puVar25 + 1);
            uVar23 = uVar22 << 8 | uVar22 >> 8;
            if (iVar7 != 0x58475346) {
              uVar23 = uVar22;
            }
            *(ushort *)((long)&pFVar11->fadeInMS + lVar29) = uVar23;
            uVar22 = *(ushort *)((long)puVar25 + 3);
            uVar23 = uVar22 << 8 | uVar22 >> 8;
            if (iVar7 != 0x58475346) {
              uVar23 = uVar22;
            }
            *(ushort *)((long)&pFVar11->fadeOutMS + lVar29) = uVar23;
            (&pFVar11->maxInstanceBehavior)[lVar29] = *(byte *)((long)puVar25 + 5) >> 3;
            uVar22 = puVar25[3];
            uVar23 = uVar22 << 8 | uVar22 >> 8;
            if (iVar7 != 0x58475346) {
              uVar23 = uVar22;
            }
            *(ushort *)((long)&pFVar11->parentCategory + lVar29) = uVar23;
            dVar30 = (double)SDL_log10((double)(byte)puVar25[4] / 28240.0);
            dVar30 = (double)SDL_pow(0x4024000000000000,
                                     (double)(float)(dVar30 * 3969.0 + 8715.0) / 2000.0);
            pFVar11 = pEngine->categories;
            *(float *)((long)&pFVar11->volume + lVar29) = (float)dVar30;
            puVar1 = (uint8_t *)((long)puVar25 + 9);
            puVar25 = puVar25 + 5;
            (&pFVar11->visibility)[lVar29] = *puVar1;
            (&pFVar11->instanceCount)[lVar29] = '\0';
            *(undefined4 *)((long)&pFVar11->currentVolume + lVar29) = 0x3f800000;
            uVar28 = uVar28 + 1;
            lVar29 = lVar29 + 0x18;
          } while (uVar28 < pEngine->categoryCount);
        }
        pFVar12 = (FACTVariable *)(*pEngine->pMalloc)((ulong)pEngine->variableCount << 4);
        pEngine->variables = pFVar12;
        uVar22 = pEngine->variableCount;
        if (uVar22 != 0) {
          lVar29 = 0;
          do {
            (&pFVar12->accessibility)[lVar29] = (uint8_t)*puVar25;
            *(undefined4 *)((long)&pFVar12->initialValue + lVar29) =
                 *(undefined4 *)((long)puVar25 + 1);
            *(undefined4 *)((long)&pFVar12->minValue + lVar29) = *(undefined4 *)((long)puVar25 + 5);
            puVar2 = (undefined4 *)((long)puVar25 + 9);
            puVar25 = (ushort *)((long)puVar25 + 0xd);
            *(undefined4 *)((long)&pFVar12->maxValue + lVar29) = *puVar2;
            lVar29 = lVar29 + 0x10;
          } while ((ulong)uVar22 * 0x10 != lVar29);
        }
        pfVar13 = (float *)(*pEngine->pMalloc)((ulong)uVar22 << 2);
        pEngine->globalVariableValues = pfVar13;
        uVar22 = pEngine->variableCount;
        if (uVar22 != 0) {
          pFVar12 = pEngine->variables;
          lVar29 = 0;
          do {
            *(float *)((long)pfVar13 + lVar29) = (&pFVar12->initialValue)[lVar29];
            lVar29 = lVar29 + 4;
          } while ((ulong)uVar22 * 4 != lVar29);
        }
        if (pEngine->rpcCount != 0) {
          pFVar14 = (FACTRPC *)(*pEngine->pMalloc)((ulong)pEngine->rpcCount << 4);
          pEngine->rpcs = pFVar14;
          puVar15 = (uint32_t *)(*pEngine->pMalloc)((ulong)pEngine->rpcCount << 2);
          pEngine->rpcCodes = puVar15;
          if (pEngine->rpcCount != 0) {
            uVar28 = 0;
            do {
              pEngine->rpcCodes[uVar28] = (int)puVar25 - (int)piVar8;
              uVar22 = *puVar25;
              uVar23 = uVar22 << 8 | uVar22 >> 8;
              if (iVar7 != 0x58475346) {
                uVar23 = uVar22;
              }
              pFVar14 = pEngine->rpcs;
              pFVar14[uVar28].variable = uVar23;
              uVar24 = puVar25[1];
              pFVar14[uVar28].pointCount = (byte)uVar24;
              uVar22 = *(ushort *)((long)puVar25 + 3);
              uVar23 = uVar22 << 8 | uVar22 >> 8;
              if (iVar7 != 0x58475346) {
                uVar23 = uVar22;
              }
              puVar25 = (ushort *)((long)puVar25 + 5);
              pFVar14[uVar28].parameter = uVar23;
              pFVar16 = (FACTRPCPoint *)(*pEngine->pMalloc)((ulong)(byte)uVar24 * 0xc);
              pFVar14 = pEngine->rpcs;
              pFVar14[uVar28].points = pFVar16;
              bVar4 = pFVar14[uVar28].pointCount;
              if (bVar4 != 0) {
                lVar29 = 0;
                do {
                  *(undefined4 *)((long)&pFVar16->x + lVar29) = *(undefined4 *)puVar25;
                  *(undefined4 *)((long)&pFVar16->y + lVar29) = *(undefined4 *)(puVar25 + 2);
                  puVar3 = puVar25 + 4;
                  puVar25 = (ushort *)((long)puVar25 + 9);
                  (&pFVar16->type)[lVar29] = (uint8_t)*puVar3;
                  lVar29 = lVar29 + 0xc;
                } while ((ulong)bVar4 * 0xc != lVar29);
              }
              uVar28 = uVar28 + 1;
            } while (uVar28 < pEngine->rpcCount);
          }
        }
        if (pEngine->dspPresetCount != 0) {
          pFVar17 = (FACTDSPPreset *)(*pEngine->pMalloc)((ulong)pEngine->dspPresetCount << 4);
          pEngine->dspPresets = pFVar17;
          puVar15 = (uint32_t *)(*pEngine->pMalloc)((ulong)pEngine->dspPresetCount << 2);
          pEngine->dspPresetCodes = puVar15;
          uVar28 = (ulong)pEngine->dspPresetCount;
          if (pEngine->dspPresetCount != 0) {
            iVar27 = (int)puVar25 - (int)piVar8;
            lVar29 = 0;
            uVar26 = 0;
            do {
              *(int *)((long)pEngine->dspPresetCodes + lVar29) = iVar27;
              pFVar17 = pEngine->dspPresets;
              (&pFVar17->accessibility)[lVar29 * 4] = (uint8_t)*puVar25;
              uVar22 = *(ushort *)((long)puVar25 + 1);
              uVar23 = uVar22 << 8 | uVar22 >> 8;
              if (iVar7 != 0x58475346) {
                uVar23 = uVar22;
              }
              (&pFVar17->parameterCount)[lVar29 * 2] = uVar23;
              puVar25 = (ushort *)((long)puVar25 + 5);
              pvVar18 = (*pEngine->pMalloc)((ulong)uVar23 * 0x14);
              *(void **)((long)&pEngine->dspPresets->parameters + lVar29 * 4) = pvVar18;
              uVar26 = uVar26 + 1;
              uVar28 = (ulong)pEngine->dspPresetCount;
              lVar29 = lVar29 + 4;
              iVar27 = iVar27 + 5;
            } while (uVar26 < uVar28);
          }
          if ((short)uVar28 != 0) {
            pFVar17 = pEngine->dspPresets;
            uVar26 = 0;
            do {
              uVar22 = pFVar17[uVar26].parameterCount;
              if (uVar22 != 0) {
                pFVar9 = pFVar17[uVar26].parameters;
                lVar29 = 0;
                do {
                  (&pFVar9->type)[lVar29] = (uint8_t)*puVar25;
                  *(undefined4 *)((long)&pFVar9->value + lVar29) =
                       *(undefined4 *)((long)puVar25 + 1);
                  *(undefined4 *)((long)&pFVar9->minVal + lVar29) =
                       *(undefined4 *)((long)puVar25 + 5);
                  *(undefined4 *)((long)&pFVar9->maxVal + lVar29) =
                       *(undefined4 *)((long)puVar25 + 9);
                  uVar23 = *(ushort *)((long)puVar25 + 0xd);
                  puVar25 = (ushort *)((long)puVar25 + 0xf);
                  uVar24 = uVar23 << 8 | uVar23 >> 8;
                  if (iVar7 != 0x58475346) {
                    uVar24 = uVar23;
                  }
                  *(ushort *)((long)&pFVar9->unknown + lVar29) = uVar24;
                  lVar29 = lVar29 + 0x14;
                } while ((ulong)uVar22 * 0x14 != lVar29);
              }
              uVar26 = uVar26 + 1;
            } while (uVar26 != uVar28);
          }
        }
        puVar25 = puVar25 + (ulong)uVar6 + (ulong)pEngine->categoryCount * 3;
        ppcVar19 = (char **)(*pEngine->pMalloc)((ulong)pEngine->categoryCount << 3);
        pEngine->categoryNames = ppcVar19;
        if (pEngine->categoryCount != 0) {
          uVar28 = 0;
          do {
            lVar29 = SDL_strlen(puVar25);
            pcVar20 = (char *)(*pEngine->pMalloc)(lVar29 + 1U);
            pEngine->categoryNames[uVar28] = pcVar20;
            SDL_memcpy(pEngine->categoryNames[uVar28],puVar25,lVar29 + 1U);
            puVar25 = (ushort *)((long)puVar25 + lVar29 + 1);
            uVar28 = uVar28 + 1;
          } while (uVar28 < pEngine->categoryCount);
        }
        uVar22 = pEngine->variableCount;
        ppcVar19 = (char **)(*pEngine->pMalloc)((ulong)uVar22 * 8);
        pEngine->variableNames = ppcVar19;
        if (pEngine->variableCount != 0) {
          puVar25 = puVar25 + (ulong)uVar5 + (ulong)uVar22 * 3;
          uVar28 = 0;
          do {
            lVar29 = SDL_strlen(puVar25);
            pcVar20 = (char *)(*pEngine->pMalloc)(lVar29 + 1U);
            pEngine->variableNames[uVar28] = pcVar20;
            SDL_memcpy(pEngine->variableNames[uVar28],puVar25,lVar29 + 1U);
            puVar25 = (ushort *)((long)puVar25 + lVar29 + 1);
            uVar28 = uVar28 + 1;
          } while (uVar28 < pEngine->variableCount);
        }
        uVar10 = 0;
        if ((pParams->globalSettingsFlags & 1) != 0) {
          pEngine->settings = pParams->pGlobalSettingsBuffer;
          uVar10 = 0;
        }
      }
    }
  }
  return uVar10;
}

Assistant:

uint32_t FACT_INTERNAL_ParseAudioEngine(
	FACTAudioEngine *pEngine,
	const FACTRuntimeParameters *pParams
) {
	uint32_t	categoryOffset,
			variableOffset,
			blob1Offset,
			categoryNameIndexOffset,
			blob2Offset,
			variableNameIndexOffset,
			categoryNameOffset,
			variableNameOffset,
			rpcOffset,
			dspPresetOffset,
			dspParameterOffset;
	uint16_t blob1Count, blob2Count;
	uint8_t version, tool;
	uint8_t se;
	uint32_t magic;
	size_t memsize;
	uint16_t i, j;

	uint8_t *ptr = (uint8_t*) pParams->pGlobalSettingsBuffer;
	uint8_t *start = ptr;

	magic = read_u32(&ptr, 0);
	se = magic == 0x58475346; /* Swap Endian */
	if (magic != 0x46534758 && magic != 0x58475346) /* 'XGSF' */
	{
		return -1; /* TODO: NOT XACT FILE */
	}

	if (!FACT_INTERNAL_SupportedContent(read_u16(&ptr, se)))
	{
		return -2;
	}

	tool = read_u16(&ptr, se); /* Tool version */
	if (tool != 42)
	{
		return -3;
	}

	ptr += 2; /* Unknown value */

	/* Last modified, unused */
	ptr += 8;

	/* XACT Version (Windows == 3, Xbox == 7) */
	version = read_u8(&ptr);
	if (	version != 3 &&
		version != 7	)
	{
		return -4; /* TODO: VERSION TOO OLD */
	}

	/* Object counts */
	pEngine->categoryCount = read_u16(&ptr, se);
	pEngine->variableCount = read_u16(&ptr, se);
	blob1Count = read_u16(&ptr, se);
	blob2Count = read_u16(&ptr, se);
	pEngine->rpcCount = read_u16(&ptr, se);
	pEngine->dspPresetCount = read_u16(&ptr, se);
	pEngine->dspParameterCount = read_u16(&ptr, se);

	/* Object offsets */
	categoryOffset = read_u32(&ptr, se);
	variableOffset = read_u32(&ptr, se);
	blob1Offset = read_u32(&ptr, se);
	categoryNameIndexOffset = read_u32(&ptr, se);
	blob2Offset = read_u32(&ptr, se);
	variableNameIndexOffset = read_u32(&ptr, se);
	categoryNameOffset = read_u32(&ptr, se);
	variableNameOffset = read_u32(&ptr, se);
	rpcOffset = read_u32(&ptr, se);
	dspPresetOffset = read_u32(&ptr, se);
	dspParameterOffset = read_u32(&ptr, se);

	/* Category data */
	FAudio_assert((ptr - start) == categoryOffset);
	pEngine->categories = (FACTAudioCategory*) pEngine->pMalloc(
		sizeof(FACTAudioCategory) * pEngine->categoryCount
	);
	for (i = 0; i < pEngine->categoryCount; i += 1)
	{
		pEngine->categories[i].instanceLimit = read_u8(&ptr);
		pEngine->categories[i].fadeInMS = read_u16(&ptr, se);
		pEngine->categories[i].fadeOutMS = read_u16(&ptr, se);
		pEngine->categories[i].maxInstanceBehavior = read_u8(&ptr) >> 3;
		pEngine->categories[i].parentCategory = read_u16(&ptr, se);
		pEngine->categories[i].volume = FACT_INTERNAL_CalculateAmplitudeRatio(
			read_volbyte(&ptr)
		);
		pEngine->categories[i].visibility = read_u8(&ptr);
		pEngine->categories[i].instanceCount = 0;
		pEngine->categories[i].currentVolume = 1.0f;
	}

	/* Variable data */
	FAudio_assert((ptr - start) == variableOffset);
	pEngine->variables = (FACTVariable*) pEngine->pMalloc(
		sizeof(FACTVariable) * pEngine->variableCount
	);
	for (i = 0; i < pEngine->variableCount; i += 1)
	{
		pEngine->variables[i].accessibility = read_u8(&ptr);
		pEngine->variables[i].initialValue = read_f32(&ptr, se);
		pEngine->variables[i].minValue = read_f32(&ptr, se);
		pEngine->variables[i].maxValue = read_f32(&ptr, se);
	}

	/* Global variable storage. Some unused data for non-global vars */
	pEngine->globalVariableValues = (float*) pEngine->pMalloc(
		sizeof(float) * pEngine->variableCount
	);
	for (i = 0; i < pEngine->variableCount; i += 1)
	{
		pEngine->globalVariableValues[i] = pEngine->variables[i].initialValue;
	}

	/* RPC data */
	if (pEngine->rpcCount > 0)
	{
		FAudio_assert((ptr - start) == rpcOffset);
		pEngine->rpcs = (FACTRPC*) pEngine->pMalloc(
			sizeof(FACTRPC) *
			pEngine->rpcCount
		);
		pEngine->rpcCodes = (uint32_t*) pEngine->pMalloc(
			sizeof(uint32_t) *
			pEngine->rpcCount
		);
		for (i = 0; i < pEngine->rpcCount; i += 1)
		{
			pEngine->rpcCodes[i] = (uint32_t) (ptr - start);
			pEngine->rpcs[i].variable = read_u16(&ptr, se);
			pEngine->rpcs[i].pointCount = read_u8(&ptr);
			pEngine->rpcs[i].parameter = read_u16(&ptr, se);
			pEngine->rpcs[i].points = (FACTRPCPoint*) pEngine->pMalloc(
				sizeof(FACTRPCPoint) *
				pEngine->rpcs[i].pointCount
			);
			for (j = 0; j < pEngine->rpcs[i].pointCount; j += 1)
			{
				pEngine->rpcs[i].points[j].x = read_f32(&ptr, se);
				pEngine->rpcs[i].points[j].y = read_f32(&ptr, se);
				pEngine->rpcs[i].points[j].type = read_u8(&ptr);
			}
		}
	}

	/* DSP Preset data */
	if (pEngine->dspPresetCount > 0)
	{
		FAudio_assert((ptr - start) == dspPresetOffset);
		pEngine->dspPresets = (FACTDSPPreset*) pEngine->pMalloc(
			sizeof(FACTDSPPreset) *
			pEngine->dspPresetCount
		);
		pEngine->dspPresetCodes = (uint32_t*) pEngine->pMalloc(
			sizeof(uint32_t) *
			pEngine->dspPresetCount
		);
		for (i = 0; i < pEngine->dspPresetCount; i += 1)
		{
			pEngine->dspPresetCodes[i] = (uint32_t) (ptr - start);
			pEngine->dspPresets[i].accessibility = read_u8(&ptr);
			pEngine->dspPresets[i].parameterCount = read_u16(&ptr, se);
			ptr += 2; /* Unknown value */
			pEngine->dspPresets[i].parameters = (FACTDSPParameter*) pEngine->pMalloc(
				sizeof(FACTDSPParameter) *
				pEngine->dspPresets[i].parameterCount
			); /* This will be filled in just a moment... */
		}

		/* DSP Parameter data */
		FAudio_assert((ptr - start) == dspParameterOffset);
		for (i = 0; i < pEngine->dspPresetCount; i += 1)
		{
			for (j = 0; j < pEngine->dspPresets[i].parameterCount; j += 1)
			{
				pEngine->dspPresets[i].parameters[j].type = read_u8(&ptr);
				pEngine->dspPresets[i].parameters[j].value = read_f32(&ptr, se);
				pEngine->dspPresets[i].parameters[j].minVal = read_f32(&ptr, se);
				pEngine->dspPresets[i].parameters[j].maxVal = read_f32(&ptr, se);
				pEngine->dspPresets[i].parameters[j].unknown = read_u16(&ptr, se);
			}
		}
	}

	/* Blob #1, no idea what this is... */
	FAudio_assert((ptr - start) == blob1Offset);
	ptr += blob1Count * 2;

	/* Category Name Index data */
	FAudio_assert((ptr - start) == categoryNameIndexOffset);
	ptr += pEngine->categoryCount * 6; /* FIXME: index as assert value? */

	/* Category Name data */
	FAudio_assert((ptr - start) == categoryNameOffset);
	pEngine->categoryNames = (char**) pEngine->pMalloc(
		sizeof(char*) *
		pEngine->categoryCount
	);
	for (i = 0; i < pEngine->categoryCount; i += 1)
	{
		memsize = FAudio_strlen((char*) ptr) + 1; /* Dastardly! */
		pEngine->categoryNames[i] = (char*) pEngine->pMalloc(memsize);
		FAudio_memcpy(pEngine->categoryNames[i], ptr, memsize);
		ptr += memsize;
	}

	/* Blob #2, no idea what this is... */
	FAudio_assert((ptr - start) == blob2Offset);
	ptr += blob2Count * 2;

	/* Variable Name Index data */
	FAudio_assert((ptr - start) == variableNameIndexOffset);
	ptr += pEngine->variableCount * 6; /* FIXME: index as assert value? */

	/* Variable Name data */
	FAudio_assert((ptr - start) == variableNameOffset);
	pEngine->variableNames = (char**) pEngine->pMalloc(
		sizeof(char*) *
		pEngine->variableCount
	);
	for (i = 0; i < pEngine->variableCount; i += 1)
	{
		memsize = FAudio_strlen((char*) ptr) + 1; /* Dastardly! */
		pEngine->variableNames[i] = (char*) pEngine->pMalloc(memsize);
		FAudio_memcpy(pEngine->variableNames[i], ptr, memsize);
		ptr += memsize;
	}

	/* Store this pointer in case we're asked to free it */
	if (pParams->globalSettingsFlags & FACT_FLAG_MANAGEDATA)
	{
		pEngine->settings = pParams->pGlobalSettingsBuffer;
	}

	/* Finally. */
	FAudio_assert((ptr - start) == pParams->globalSettingsBufferSize);
	return 0;
}